

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueStart
          (CLIntercept *this,char *flushOrFinish,char *functionName)

{
  mutex *__mutex;
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *unaff_R13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar10;
  allocator local_ea;
  allocator local_e9;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    if (local_68 != (long *)functionName) {
      operator_delete(local_68);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    if (local_c8 != unaff_R13) {
      operator_delete(local_c8);
    }
    if (local_88 != (long *)flushOrFinish) {
      operator_delete(local_88);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  std::__cxx11::string::string((string *)local_48,flushOrFinish,&local_e9);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1a91bc);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_78 = *plVar6;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar6;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_b8 = *puVar7;
    lStack_b0 = plVar3[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *puVar7;
    local_c8 = (ulong *)*plVar3;
  }
  local_c0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::string((string *)&local_a8,functionName,&local_ea);
  uVar8 = 0xf;
  if (local_c8 != &local_b8) {
    uVar8 = local_b8;
  }
  if (uVar8 < (ulong)(local_a0 + local_c0)) {
    uVar8 = 0xf;
    if (local_a8 != local_98) {
      uVar8 = local_98[0];
    }
    if ((ulong)(local_a0 + local_c0) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8);
      goto LAB_0016efc5;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
LAB_0016efc5:
  local_e8 = &local_d8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar4[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar4;
  }
  local_e0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    uVar9 = (undefined4)*plVar6;
    uVar10 = *(undefined4 *)((long)plVar3 + 0x14);
    local_58 = *plVar6;
    uStack_50 = (undefined4)plVar3[3];
    uStack_4c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    uVar9 = extraout_XMM0_Da;
    uVar10 = extraout_XMM0_Db;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  log(this,(double)CONCAT44(uVar10,uVar9));
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueStart(
    const char* flushOrFinish,
    const char* functionName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Calling " + std::string(flushOrFinish) + " after " + std::string(functionName) + "...\n" );
}